

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O1

void add_door(level *lev,int x,int y,mkroom *aroom)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  schar *psVar4;
  
  aroom->doorct = aroom->doorct + '\x01';
  uVar2 = lev->doorindex;
  uVar3 = (ulong)uVar2;
  if ((-1 < aroom[1].hx) && ((int)aroom[1].fdoor < (int)uVar2)) {
    uVar3 = (ulong)(int)uVar2;
    do {
      lev->doors[uVar3] = lev->doors[uVar3 - 1];
      uVar3 = uVar3 - 1;
    } while ((long)aroom[1].fdoor < (long)uVar3);
  }
  lev->doorindex = lev->doorindex + 1;
  lev->doors[(int)uVar3].x = (xchar)x;
  lev->doors[(int)uVar3].y = (xchar)y;
  if (-1 < aroom[1].hx) {
    psVar4 = &aroom[1].fdoor;
    do {
      *psVar4 = *psVar4 + '\x01';
      pcVar1 = psVar4 + 0xd1;
      psVar4 = psVar4 + 0xd8;
    } while (-1 < *pcVar1);
  }
  return;
}

Assistant:

void add_door(struct level *lev, int x, int y, struct mkroom *aroom)
{
	struct mkroom *broom;
	int tmp;

	aroom->doorct++;
	broom = aroom+1;
	if (broom->hx < 0)
		tmp = lev->doorindex;
	else
		for (tmp = lev->doorindex; tmp > broom->fdoor; tmp--)
			lev->doors[tmp] = lev->doors[tmp-1];
	lev->doorindex++;
	lev->doors[tmp].x = x;
	lev->doors[tmp].y = y;
	for ( ; broom->hx >= 0; broom++) broom->fdoor++;
}